

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_subset(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *funcptr;
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  size_t idx;
  ulong element_count;
  uint16_t tmp;
  size_t idx_00;
  vm_val_t ele;
  vm_rcdesc rc;
  
  if (getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar6 != 0) {
      getp_subset::desc.min_argc_ = 1;
      getp_subset::desc.opt_argc_ = 0;
      getp_subset::desc.varargs_ = 0;
      __cxa_guard_release(&getp_subset(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  vm_rcdesc::vm_rcdesc(&rc,"Vector.subset",self,5,sp_ + -1,argc);
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_subset::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    funcptr = sp_ + -1;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar5->val).obj = self;
    element_count = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    idx_00 = 0;
    vVar7 = create(0,element_count);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar7 >> 0xc];
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    for (idx = 0; element_count != idx; idx = idx + 1) {
      get_element(this,idx,&ele);
      pvVar5 = sp_;
      sp_ = sp_ + 1;
      pvVar5->typ = ele.typ;
      *(undefined4 *)&pvVar5->field_0x4 = ele._4_4_;
      pvVar5->val = ele.val;
      CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,&rc,0);
      if ((r0_.typ != VM_NIL) && ((r0_.typ != VM_INT || (r0_.val.obj != 0)))) {
        set_element((CVmObjVector *)(pCVar1 + (vVar7 & 0xfff)),idx_00,&ele);
        idx_00 = idx_00 + 1;
      }
    }
    *(short *)(*(long *)((long)&pCVar1[vVar7 & 0xfff].ptr_ + 8) + 2) = (short)idx_00;
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_subset(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *argc)
{
    const vm_val_t *func_val;
    size_t src;
    size_t dst;
    size_t cnt;
    CVmObjVector *new_vec;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.subset", self, 5, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate the new vector that we'll return - all we know at this
     *   point is that the new vector won't be larger than the current
     *   vector, so allocate at the current size 
     */
    cnt = get_element_count();
    retval->set_obj(create(vmg_ FALSE, cnt));

    /* get the return value as an vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  If the element passes, write it to the current
     *   output location in the list; otherwise, just skip it.
     *   
     *   Note that we're using the same list as source and destination,
     *   which is easy because the list will either shrink or stay the
     *   same - we'll never need to insert new elements.  
     */
    for (src = dst = 0 ; src < cnt ; ++src)
    {
        vm_val_t ele;
        const vm_val_t *val;

        /* get this element from the source vector */
        get_element(src, &ele);

        /* push the element as the callback's argument */
        G_stk->push(&ele);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* 
         *   if the callback returned non-nil and non-zero, include this
         *   element in the result 
         */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* 
             *   include this element in the result (there's no need to
             *   save undo, since the whole vector is new) 
             */
            new_vec->set_element(dst, &ele);

            /* advance the output index */
            ++dst;
        }
    }

    /* set the actual number of elements in the result */
    new_vec->set_element_count(dst);

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}